

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

xml_node __thiscall pugi::xml_node::insert_move_after(xml_node *this,xml_node *moved,xml_node *node)

{
  xml_node_struct *pxVar1;
  xml_node_struct *pxVar2;
  xml_node_struct *pxVar3;
  xml_node_struct *pxVar4;
  bool bVar5;
  xml_node_struct **ppxVar6;
  xml_node_struct *pxVar7;
  xml_node_struct *pxVar8;
  xml_node local_20;
  
  bVar5 = impl::anon_unknown_0::allow_move(this,moved);
  if ((((bVar5) && (pxVar1 = node->_root, pxVar1 != (xml_node_struct *)0x0)) &&
      (pxVar2 = pxVar1->parent, pxVar2 == this->_root)) && (pxVar3 = moved->_root, pxVar3 != pxVar1)
     ) {
    pxVar4 = pxVar3->parent;
    pxVar7 = pxVar3->next_sibling;
    pxVar8 = pxVar7;
    if ((pxVar7 != (xml_node_struct *)0x0) ||
       (pxVar8 = pxVar4->first_child, pxVar8 != (xml_node_struct *)0x0)) {
      pxVar8->prev_sibling_c = pxVar3->prev_sibling_c;
    }
    ppxVar6 = &pxVar4->first_child;
    if (pxVar3->prev_sibling_c->next_sibling != (xml_node_struct *)0x0) {
      ppxVar6 = &pxVar3->prev_sibling_c->next_sibling;
    }
    *ppxVar6 = pxVar7;
    pxVar3->parent = pxVar2;
    pxVar4 = pxVar1->next_sibling;
    pxVar7 = pxVar4;
    if (pxVar4 == (xml_node_struct *)0x0) {
      pxVar7 = pxVar2->first_child;
    }
    pxVar7->prev_sibling_c = pxVar3;
    pxVar3->next_sibling = pxVar4;
    pxVar3->prev_sibling_c = pxVar1;
    pxVar1->next_sibling = pxVar3;
    local_20 = (xml_node)moved->_root;
  }
  else {
    xml_node(&local_20);
  }
  return (xml_node)local_20._root;
}

Assistant:

PUGI__FN xml_node xml_node::insert_move_after(const xml_node& moved, const xml_node& node)
	{
		if (!impl::allow_move(*this, moved)) return xml_node();
		if (!node._root || node._root->parent != _root) return xml_node();
		if (moved._root == node._root) return xml_node();

		impl::remove_node(moved._root);
		impl::insert_node_after(moved._root, node._root);

		return moved;
	}